

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  uint uVar2;
  reference ppDVar3;
  DescriptorDatabase *source;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  *__range2;
  FileDescriptorProto *output_local;
  string *filename_local;
  MergedDescriptorDatabase *this_local;
  
  __end2 = std::
           vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
           ::begin(&this->sources_);
  source = (DescriptorDatabase *)
           std::
           vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
           ::end(&this->sources_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
                                *)&source);
    if (!bVar1) {
      return false;
    }
    ppDVar3 = __gnu_cxx::
              __normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
              ::operator*(&__end2);
    uVar2 = (*(*ppDVar3)->_vptr_DescriptorDatabase[2])(*ppDVar3,filename,output);
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool MergedDescriptorDatabase::FindFileByName(const std::string& filename,
                                              FileDescriptorProto* output) {
  for (DescriptorDatabase* source : sources_) {
    if (source->FindFileByName(filename, output)) {
      return true;
    }
  }
  return false;
}